

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_dependence.cpp
# Opt level: O1

bool __thiscall
spvtools::opt::LoopDependenceAnalysis::GetDependence
          (LoopDependenceAnalysis *this,Instruction *source,Instruction *destination,
          DistanceVector *distance_vector)

{
  _Rb_tree<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::_Identity<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>
  *__t;
  ScalarEvolutionAnalysis *pSVar1;
  Op OVar2;
  pointer pDVar3;
  pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*> *ppVar4;
  _Rb_tree<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::_Identity<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>
  *p_Var5;
  pointer ppVar6;
  bool bVar7;
  int iVar8;
  DistanceEntry *entry;
  Instruction *pIVar9;
  Instruction *pIVar10;
  pointer pDVar11;
  _Rb_tree<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::_Identity<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>
  *p_Var12;
  SENode *pSVar13;
  SENode *pSVar14;
  Loop *loop;
  DistanceEntry *pDVar15;
  _Base_ptr p_Var16;
  _Rb_tree_node_base *p_Var17;
  ulong uVar18;
  undefined8 uVar19;
  _Alloc_hider _Var20;
  LoopDependenceAnalysis *this_00;
  Instruction *pIVar21;
  vector<spvtools::opt::DistanceEntry,_std::allocator<spvtools::opt::DistanceEntry>_> *__range4;
  _Rb_tree<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::_Identity<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>
  *p_Var22;
  _Rb_tree<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::_Identity<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>
  *this_01;
  set<const_spvtools::opt::Loop_*,_std::less<const_spvtools::opt::Loop_*>,_std::allocator<const_spvtools::opt::Loop_*>_>
  current_loops;
  pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*> subscript_pair;
  PartitionedSubscripts sets_of_subscripts;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
  destination_subscripts;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
  source_subscripts;
  vector<std::pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*>,_std::allocator<std::pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*>_>_>
  local_238;
  _Rb_tree<const_spvtools::opt::Loop_*,_const_spvtools::opt::Loop_*,_std::_Identity<const_spvtools::opt::Loop_*>,_std::less<const_spvtools::opt::Loop_*>,_std::allocator<const_spvtools::opt::Loop_*>_>
  local_218;
  undefined1 local_1e8 [8];
  _Rb_tree_node_base _Stack_1e0;
  undefined1 local_1b8 [32];
  PartitionedSubscripts local_198;
  string local_180;
  string local_160;
  string local_140;
  string local_120;
  string local_100;
  string local_e0;
  string local_c0;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> local_a0;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> local_88;
  string local_70;
  string local_50;
  
  MarkUnsusedDistanceEntriesAsIrrelevant(this,source,destination,distance_vector);
  pIVar9 = GetOperandDefinition(this,source,0);
  pIVar10 = GetOperandDefinition(this,destination,0);
  OVar2 = pIVar9->opcode_;
  if (pIVar10->opcode_ != OpAccessChain && OVar2 != OpAccessChain) {
    if (pIVar9 == pIVar10) {
      pDVar3 = (distance_vector->entries).
               super__Vector_base<spvtools::opt::DistanceEntry,_std::allocator<spvtools::opt::DistanceEntry>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pDVar11 = (distance_vector->entries).
                     super__Vector_base<spvtools::opt::DistanceEntry,_std::allocator<spvtools::opt::DistanceEntry>_>
                     ._M_impl.super__Vector_impl_data._M_start; pDVar11 != pDVar3;
          pDVar11 = pDVar11 + 1) {
        pDVar11->dependence_information = UNKNOWN;
        pDVar11->direction = ALL;
        pDVar11->distance = 0;
        pDVar11->peel_first = false;
        pDVar11->peel_last = false;
        *(ulong *)&pDVar11->field_0x12 = (ulong)(uint6)local_218._M_impl._0_6_;
        *(undefined8 *)((long)&pDVar11->point_x + 2) = 0;
        pDVar11->point_y = 0;
      }
      return false;
    }
    return true;
  }
  if ((OVar2 == OpAccessChain) != (pIVar10->opcode_ == OpAccessChain)) {
    pIVar21 = pIVar9;
    if (OVar2 == OpAccessChain) {
      pIVar21 = pIVar10;
      pIVar10 = pIVar9;
    }
    pIVar10 = GetOperandDefinition(this,pIVar10,0);
    if (pIVar21 == pIVar10) {
      pDVar3 = (distance_vector->entries).
               super__Vector_base<spvtools::opt::DistanceEntry,_std::allocator<spvtools::opt::DistanceEntry>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pDVar11 = (distance_vector->entries).
                     super__Vector_base<spvtools::opt::DistanceEntry,_std::allocator<spvtools::opt::DistanceEntry>_>
                     ._M_impl.super__Vector_impl_data._M_start; pDVar11 != pDVar3;
          pDVar11 = pDVar11 + 1) {
        pDVar11->dependence_information = UNKNOWN;
        pDVar11->direction = ALL;
        pDVar11->distance = 0;
        pDVar11->peel_first = false;
        pDVar11->peel_last = false;
        *(ulong *)&pDVar11->field_0x12 = (ulong)(uint6)local_218._M_impl._0_6_;
        *(undefined8 *)((long)&pDVar11->point_x + 2) = 0;
        pDVar11->point_y = 0;
      }
      return false;
    }
    return pIVar21 != pIVar10;
  }
  pIVar9 = GetOperandDefinition(this,pIVar9,0);
  pIVar10 = GetOperandDefinition(this,pIVar10,0);
  if ((pIVar9->opcode_ == OpAccessChain) || (pIVar10->opcode_ == OpAccessChain)) {
    pDVar3 = (distance_vector->entries).
             super__Vector_base<spvtools::opt::DistanceEntry,_std::allocator<spvtools::opt::DistanceEntry>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pDVar11 = (distance_vector->entries).
                   super__Vector_base<spvtools::opt::DistanceEntry,_std::allocator<spvtools::opt::DistanceEntry>_>
                   ._M_impl.super__Vector_impl_data._M_start; pDVar11 != pDVar3;
        pDVar11 = pDVar11 + 1) {
      pDVar11->dependence_information = UNKNOWN;
      pDVar11->direction = ALL;
      pDVar11->distance = 0;
      pDVar11->peel_first = false;
      pDVar11->peel_last = false;
      *(ulong *)&pDVar11->field_0x12 = (ulong)(uint6)local_218._M_impl._0_6_;
      *(undefined8 *)((long)&pDVar11->point_x + 2) = 0;
      pDVar11->point_y = 0;
    }
    return false;
  }
  if (pIVar9 != pIVar10) {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"Proved independence through different arrays.","");
    PrintDebug(this,&local_50);
    bVar7 = true;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p == &local_50.field_2) {
      return true;
    }
    uVar18 = local_50.field_2._M_allocated_capacity + 1;
    local_88.
    super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)local_50._M_dataplus._M_p;
    goto LAB_0061310c;
  }
  GetSubscripts(&local_88,this,source);
  GetSubscripts(&local_a0,this,destination);
  PartitionSubscripts(&local_198,this,&local_88,&local_a0);
  this_01 = &(local_198.
              super__Vector_base<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>,_std::allocator<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->_M_t;
  p_Var12 = &(local_198.
              super__Vector_base<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>,_std::allocator<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish)->_M_t;
  if (local_198.
      super__Vector_base<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>,_std::allocator<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_198.
      super__Vector_base<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>,_std::allocator<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      while (p_Var22 = this_01 + 1, (this_01->_M_impl).super__Rb_tree_header._M_node_count != 1) {
        do {
          __t = p_Var12 + -1;
          if (__t == this_01) goto LAB_00612a3c;
          p_Var5 = p_Var12 + -1;
          p_Var12 = __t;
        } while ((p_Var5->_M_impl).super__Rb_tree_header._M_node_count != 1);
        std::
        _Rb_tree<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::_Identity<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>
        ::swap(this_01,__t);
        this_01 = p_Var22;
        if (__t == p_Var22) goto LAB_00612a3c;
      }
      this_01 = p_Var22;
    } while (p_Var22 != p_Var12);
  }
LAB_00612a3c:
  if (local_198.
      super__Vector_base<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>,_std::allocator<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start < this_01) {
    pSVar1 = &this->scalar_evolution_;
    p_Var12 = &(local_198.
                super__Vector_base<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>,_std::allocator<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->_M_t;
    do {
      p_Var16 = (p_Var12->_M_impl).super__Rb_tree_header._M_header._M_left;
      pIVar10 = (Instruction *)p_Var16[1]._M_parent;
      pSVar13 = ScalarEvolutionAnalysis::AnalyzeInstruction(pSVar1,*(Instruction **)(p_Var16 + 1));
      pSVar13 = ScalarEvolutionAnalysis::SimplifyExpression(pSVar1,pSVar13);
      pSVar14 = ScalarEvolutionAnalysis::AnalyzeInstruction(pSVar1,pIVar10);
      pSVar14 = ScalarEvolutionAnalysis::SimplifyExpression(pSVar1,pSVar14);
      local_1e8 = (undefined1  [8])pSVar13;
      _Stack_1e0._0_8_ = pSVar14;
      loop = GetLoopForSubscriptPair
                       (this,(pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*> *)local_1e8);
      if ((loop == (Loop *)0x0) || (bVar7 = IsSupportedLoop(this,loop), bVar7)) {
        iVar8 = (**pSVar13->_vptr_SENode)(pSVar13);
        if ((iVar8 == 6) || (iVar8 = (**pSVar14->_vptr_SENode)(pSVar14), iVar8 == 6)) {
          local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_e0,
                     "GetDependence found source_node || destination_node as CanNotCompute. Abandoning evaluation for this subscript."
                     ,"");
          PrintDebug(this,&local_e0);
          uVar19 = local_e0.field_2._M_allocated_capacity;
          _Var20._M_p = local_e0._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e0._M_dataplus._M_p != &local_e0.field_2) goto LAB_00612b81;
          goto LAB_00612b89;
        }
        bVar7 = IsZIV(this,(pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*> *)local_1e8);
        if (bVar7) {
          local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_140,"Found a ZIV subscript pair","");
          PrintDebug(this,&local_140);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_140._M_dataplus._M_p != &local_140.field_2) {
            operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
          }
          bVar7 = ZIVTest(this,(pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*> *)local_1e8);
          if (!bVar7) goto LAB_00612cb4;
          local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_100,"Proved independence with ZIVTest.","");
          PrintDebug(this,&local_100);
          iVar8 = 1;
          uVar19 = local_100.field_2._M_allocated_capacity;
          _Var20._M_p = local_100._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_100._M_dataplus._M_p != &local_100.field_2) {
LAB_00612d95:
            iVar8 = 1;
            operator_delete(_Var20._M_p,uVar19 + 1);
          }
        }
        else {
LAB_00612cb4:
          bVar7 = IsSIV(this,(pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*> *)local_1e8);
          if (bVar7) {
            local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_160,"Found a SIV subscript pair.","");
            PrintDebug(this,&local_160);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_160._M_dataplus._M_p != &local_160.field_2) {
              operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1
                             );
            }
            bVar7 = SIVTest(this,(pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*> *)local_1e8
                            ,distance_vector);
            if (bVar7) {
              local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_120,"Proved independence with SIVTest.","");
              PrintDebug(this,&local_120);
              iVar8 = 1;
              uVar19 = local_120.field_2._M_allocated_capacity;
              _Var20._M_p = local_120._M_dataplus._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_120._M_dataplus._M_p != &local_120.field_2) goto LAB_00612d95;
              goto LAB_00612bac;
            }
          }
          bVar7 = IsMIV(this,(pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*> *)local_1e8);
          iVar8 = 0;
          if (bVar7) {
            local_1b8._0_8_ = local_1b8 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_1b8,"Found a MIV subscript pair.","");
            PrintDebug(this,(string *)local_1b8);
            this_00 = (LoopDependenceAnalysis *)local_1b8._0_8_;
            if ((LoopDependenceAnalysis *)local_1b8._0_8_ !=
                (LoopDependenceAnalysis *)(local_1b8 + 0x10)) {
              operator_delete((void *)local_1b8._0_8_,local_1b8._16_8_ + 1);
            }
            bVar7 = GCDMIVTest(this_00,(pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*> *)
                                       local_1e8);
            if (bVar7) {
              local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_180,"Proved independence with the GCD test.","");
              PrintDebug(this,&local_180);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_180._M_dataplus._M_p != &local_180.field_2) {
                operator_delete(local_180._M_dataplus._M_p,
                                local_180.field_2._M_allocated_capacity + 1);
              }
              CollectLoops((set<const_spvtools::opt::Loop_*,_std::less<const_spvtools::opt::Loop_*>,_std::allocator<const_spvtools::opt::Loop_*>_>
                            *)&local_218,this,pSVar13,pSVar14);
              for (p_Var17 = local_218._M_impl.super__Rb_tree_header._M_header._M_left;
                  (_Rb_tree_header *)p_Var17 != &local_218._M_impl.super__Rb_tree_header;
                  p_Var17 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var17)) {
                pDVar15 = GetDistanceEntryForLoop(this,*(Loop **)(p_Var17 + 1),distance_vector);
                pDVar15->direction = NONE;
              }
              std::
              _Rb_tree<const_spvtools::opt::Loop_*,_const_spvtools::opt::Loop_*,_std::_Identity<const_spvtools::opt::Loop_*>,_std::less<const_spvtools::opt::Loop_*>,_std::allocator<const_spvtools::opt::Loop_*>_>
              ::_M_erase(&local_218,
                         (_Link_type)
                         CONCAT26(local_218._M_impl.super__Rb_tree_header._M_header._M_parent._6_2_,
                                  local_218._M_impl.super__Rb_tree_header._M_header._M_parent._0_6_)
                        );
              iVar8 = 1;
            }
          }
        }
      }
      else {
        local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_c0,
                   "GetDependence found an unsupported loop form. Assuming <=> for loop.","");
        PrintDebug(this,&local_c0);
        uVar19 = local_c0.field_2._M_allocated_capacity;
        _Var20._M_p = local_c0._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
LAB_00612b81:
          operator_delete(_Var20._M_p,uVar19 + 1);
        }
LAB_00612b89:
        pDVar15 = GetDistanceEntryForSubscriptPair
                            (this,(pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*> *)
                                  local_1e8,distance_vector);
        iVar8 = 10;
        if (pDVar15 != (DistanceEntry *)0x0) {
          pDVar15->direction = ALL;
        }
      }
LAB_00612bac:
      if ((iVar8 != 10) && (iVar8 != 0)) goto LAB_006130c4;
      p_Var12 = p_Var12 + 1;
    } while (p_Var12 < this_01);
  }
  if (this_01 < local_198.
                super__Vector_base<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>,_std::allocator<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    pSVar1 = &this->scalar_evolution_;
    do {
      std::
      _Rb_tree<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::_Identity<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>
      ::_Rb_tree((_Rb_tree<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::_Identity<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>
                  *)&local_218,this_01);
      local_238.
      super__Vector_base<std::pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*>,_std::allocator<std::pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*> *)0x0;
      local_238.
      super__Vector_base<std::pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*>,_std::allocator<std::pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*> *)0x0;
      local_238.
      super__Vector_base<std::pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*>,_std::allocator<std::pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*> *)0x0;
      for (p_Var16 = local_218._M_impl.super__Rb_tree_header._M_header._M_left;
          ppVar6 = local_238.
                   super__Vector_base<std::pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*>,_std::allocator<std::pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish,
          ppVar4 = local_238.
                   super__Vector_base<std::pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*>,_std::allocator<std::pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
          (_Rb_tree_header *)p_Var16 != &local_218._M_impl.super__Rb_tree_header;
          p_Var16 = (_Base_ptr)std::_Rb_tree_increment(p_Var16)) {
        pIVar10 = (Instruction *)p_Var16[1]._M_parent;
        pSVar13 = ScalarEvolutionAnalysis::AnalyzeInstruction(pSVar1,*(Instruction **)(p_Var16 + 1))
        ;
        pSVar13 = ScalarEvolutionAnalysis::SimplifyExpression(pSVar1,pSVar13);
        pSVar14 = ScalarEvolutionAnalysis::AnalyzeInstruction(pSVar1,pIVar10);
        _Stack_1e0._0_8_ = ScalarEvolutionAnalysis::SimplifyExpression(pSVar1,pSVar14);
        local_1e8 = (undefined1  [8])pSVar13;
        if (local_238.
            super__Vector_base<std::pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*>,_std::allocator<std::pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*>_>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            local_238.
            super__Vector_base<std::pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*>,_std::allocator<std::pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<std::pair<spvtools::opt::SENode*,spvtools::opt::SENode*>,std::allocator<std::pair<spvtools::opt::SENode*,spvtools::opt::SENode*>>>
          ::_M_realloc_insert<std::pair<spvtools::opt::SENode*,spvtools::opt::SENode*>>
                    ((vector<std::pair<spvtools::opt::SENode*,spvtools::opt::SENode*>,std::allocator<std::pair<spvtools::opt::SENode*,spvtools::opt::SENode*>>>
                      *)&local_238,
                     (iterator)
                     local_238.
                     super__Vector_base<std::pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*>,_std::allocator<std::pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,
                     (pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*> *)local_1e8);
        }
        else {
          (local_238.
           super__Vector_base<std::pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*>,_std::allocator<std::pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*>_>_>
           ._M_impl.super__Vector_impl_data._M_finish)->first = pSVar13;
          (local_238.
           super__Vector_base<std::pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*>,_std::allocator<std::pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*>_>_>
           ._M_impl.super__Vector_impl_data._M_finish)->second = (SENode *)_Stack_1e0._0_8_;
          local_238.
          super__Vector_base<std::pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*>,_std::allocator<std::pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               local_238.
               super__Vector_base<std::pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*>,_std::allocator<std::pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*>_>_>
               ._M_impl.super__Vector_impl_data._M_finish + 1;
        }
      }
      for (; ppVar4 != ppVar6; ppVar4 = ppVar4 + 1) {
        CollectLoops((set<const_spvtools::opt::Loop_*,_std::less<const_spvtools::opt::Loop_*>,_std::allocator<const_spvtools::opt::Loop_*>_>
                      *)local_1e8,this,ppVar4->first,ppVar4->second);
        p_Var17 = _Stack_1e0._M_left;
        while ((p_Var17 != &_Stack_1e0 &&
               (bVar7 = IsSupportedLoop(this,*(Loop **)(p_Var17 + 1)), bVar7))) {
          p_Var17 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var17);
        }
        std::
        _Rb_tree<const_spvtools::opt::Loop_*,_const_spvtools::opt::Loop_*,_std::_Identity<const_spvtools::opt::Loop_*>,_std::less<const_spvtools::opt::Loop_*>,_std::allocator<const_spvtools::opt::Loop_*>_>
        ::_M_erase((_Rb_tree<const_spvtools::opt::Loop_*,_const_spvtools::opt::Loop_*,_std::_Identity<const_spvtools::opt::Loop_*>,_std::less<const_spvtools::opt::Loop_*>,_std::allocator<const_spvtools::opt::Loop_*>_>
                    *)local_1e8,(_Link_type)_Stack_1e0._M_parent);
      }
      bVar7 = DeltaTest(this,&local_238,distance_vector);
      if (local_238.
          super__Vector_base<std::pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*>,_std::allocator<std::pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*> *)0x0) {
        operator_delete(local_238.
                        super__Vector_base<std::pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*>,_std::allocator<std::pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_238.
                              super__Vector_base<std::pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*>,_std::allocator<std::pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_238.
                              super__Vector_base<std::pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*>,_std::allocator<std::pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      std::
      _Rb_tree<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::_Identity<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>
      ::_M_erase((_Rb_tree<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::_Identity<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>
                  *)&local_218,
                 (_Link_type)
                 CONCAT26(local_218._M_impl.super__Rb_tree_header._M_header._M_parent._6_2_,
                          local_218._M_impl.super__Rb_tree_header._M_header._M_parent._0_6_));
      if (bVar7) goto LAB_006130c4;
      this_01 = this_01 + 1;
    } while (this_01 < local_198.
                       super__Vector_base<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>,_std::allocator<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,
             "Couldn\'t prove independence.\nAll possible direction information has been collected in the input DistanceVector."
             ,"");
  PrintDebug(this,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  bVar7 = false;
LAB_006130c6:
  std::
  vector<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>,_std::allocator<std::set<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>,_std::less<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*>_>_>_>_>
  ::~vector(&local_198);
  if (local_a0.
      super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a0.
                    super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_a0.
                          super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a0.
                          super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88.
         super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
         ._M_impl.super__Vector_impl_data._M_start ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    return bVar7;
  }
  uVar18 = (long)local_88.
                 super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage -
           (long)local_88.
                 super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
LAB_0061310c:
  operator_delete(local_88.
                  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                  ._M_impl.super__Vector_impl_data._M_start,uVar18);
  return bVar7;
LAB_006130c4:
  bVar7 = true;
  goto LAB_006130c6;
}

Assistant:

bool LoopDependenceAnalysis::GetDependence(const Instruction* source,
                                           const Instruction* destination,
                                           DistanceVector* distance_vector) {
  // Start off by finding and marking all the loops in |loops_| that are
  // irrelevant to the dependence analysis.
  MarkUnsusedDistanceEntriesAsIrrelevant(source, destination, distance_vector);

  Instruction* source_access_chain = GetOperandDefinition(source, 0);
  Instruction* destination_access_chain = GetOperandDefinition(destination, 0);

  auto num_access_chains =
      (source_access_chain->opcode() == spv::Op::OpAccessChain) +
      (destination_access_chain->opcode() == spv::Op::OpAccessChain);

  // If neither is an access chain, then they are load/store to a variable.
  if (num_access_chains == 0) {
    if (source_access_chain != destination_access_chain) {
      // Not the same location, report independence
      return true;
    } else {
      // Accessing the same variable
      for (auto& entry : distance_vector->GetEntries()) {
        entry = DistanceEntry();
      }
      return false;
    }
  }

  // If only one is an access chain, it could be accessing a part of a struct
  if (num_access_chains == 1) {
    auto source_is_chain =
        source_access_chain->opcode() == spv::Op::OpAccessChain;
    auto access_chain =
        source_is_chain ? source_access_chain : destination_access_chain;
    auto variable =
        source_is_chain ? destination_access_chain : source_access_chain;

    auto location_in_chain = GetOperandDefinition(access_chain, 0);

    if (variable != location_in_chain) {
      // Not the same location, report independence
      return true;
    } else {
      // Accessing the same variable
      for (auto& entry : distance_vector->GetEntries()) {
        entry = DistanceEntry();
      }
      return false;
    }
  }

  // If the access chains aren't collecting from the same structure there is no
  // dependence.
  Instruction* source_array = GetOperandDefinition(source_access_chain, 0);
  Instruction* destination_array =
      GetOperandDefinition(destination_access_chain, 0);

  // Nested access chains are not supported yet, bail out.
  if (source_array->opcode() == spv::Op::OpAccessChain ||
      destination_array->opcode() == spv::Op::OpAccessChain) {
    for (auto& entry : distance_vector->GetEntries()) {
      entry = DistanceEntry();
    }
    return false;
  }

  if (source_array != destination_array) {
    PrintDebug("Proved independence through different arrays.");
    return true;
  }

  // To handle multiple subscripts we must get every operand in the access
  // chains past the first.
  std::vector<Instruction*> source_subscripts = GetSubscripts(source);
  std::vector<Instruction*> destination_subscripts = GetSubscripts(destination);

  auto sets_of_subscripts =
      PartitionSubscripts(source_subscripts, destination_subscripts);

  auto first_coupled = std::partition(
      std::begin(sets_of_subscripts), std::end(sets_of_subscripts),
      [](const std::set<std::pair<Instruction*, Instruction*>>& set) {
        return set.size() == 1;
      });

  // Go through each subscript testing for independence.
  // If any subscript results in independence, we prove independence between the
  // load and store.
  // If we can't prove independence we store what information we can gather in
  // a DistanceVector.
  for (auto it = std::begin(sets_of_subscripts); it < first_coupled; ++it) {
    auto source_subscript = std::get<0>(*(*it).begin());
    auto destination_subscript = std::get<1>(*(*it).begin());

    SENode* source_node = scalar_evolution_.SimplifyExpression(
        scalar_evolution_.AnalyzeInstruction(source_subscript));
    SENode* destination_node = scalar_evolution_.SimplifyExpression(
        scalar_evolution_.AnalyzeInstruction(destination_subscript));

    // Check the loops are in a form we support.
    auto subscript_pair = std::make_pair(source_node, destination_node);

    const Loop* loop = GetLoopForSubscriptPair(subscript_pair);
    if (loop) {
      if (!IsSupportedLoop(loop)) {
        PrintDebug(
            "GetDependence found an unsupported loop form. Assuming <=> for "
            "loop.");
        DistanceEntry* distance_entry =
            GetDistanceEntryForSubscriptPair(subscript_pair, distance_vector);
        if (distance_entry) {
          distance_entry->direction = DistanceEntry::Directions::ALL;
        }
        continue;
      }
    }

    // If either node is simplified to a CanNotCompute we can't perform any
    // analysis so must assume <=> dependence and return.
    if (source_node->GetType() == SENode::CanNotCompute ||
        destination_node->GetType() == SENode::CanNotCompute) {
      // Record the <=> dependence if we can get a DistanceEntry
      PrintDebug(
          "GetDependence found source_node || destination_node as "
          "CanNotCompute. Abandoning evaluation for this subscript.");
      DistanceEntry* distance_entry =
          GetDistanceEntryForSubscriptPair(subscript_pair, distance_vector);
      if (distance_entry) {
        distance_entry->direction = DistanceEntry::Directions::ALL;
      }
      continue;
    }

    // We have no induction variables so can apply a ZIV test.
    if (IsZIV(subscript_pair)) {
      PrintDebug("Found a ZIV subscript pair");
      if (ZIVTest(subscript_pair)) {
        PrintDebug("Proved independence with ZIVTest.");
        return true;
      }
    }

    // We have only one induction variable so should attempt an SIV test.
    if (IsSIV(subscript_pair)) {
      PrintDebug("Found a SIV subscript pair.");
      if (SIVTest(subscript_pair, distance_vector)) {
        PrintDebug("Proved independence with SIVTest.");
        return true;
      }
    }

    // We have multiple induction variables so should attempt an MIV test.
    if (IsMIV(subscript_pair)) {
      PrintDebug("Found a MIV subscript pair.");
      if (GCDMIVTest(subscript_pair)) {
        PrintDebug("Proved independence with the GCD test.");
        auto current_loops = CollectLoops(source_node, destination_node);

        for (auto current_loop : current_loops) {
          auto distance_entry =
              GetDistanceEntryForLoop(current_loop, distance_vector);
          distance_entry->direction = DistanceEntry::Directions::NONE;
        }
        return true;
      }
    }
  }

  for (auto it = first_coupled; it < std::end(sets_of_subscripts); ++it) {
    auto coupled_instructions = *it;
    std::vector<SubscriptPair> coupled_subscripts{};

    for (const auto& elem : coupled_instructions) {
      auto source_subscript = std::get<0>(elem);
      auto destination_subscript = std::get<1>(elem);

      SENode* source_node = scalar_evolution_.SimplifyExpression(
          scalar_evolution_.AnalyzeInstruction(source_subscript));
      SENode* destination_node = scalar_evolution_.SimplifyExpression(
          scalar_evolution_.AnalyzeInstruction(destination_subscript));

      coupled_subscripts.push_back({source_node, destination_node});
    }

    auto supported = true;

    for (const auto& subscript : coupled_subscripts) {
      auto loops = CollectLoops(std::get<0>(subscript), std::get<1>(subscript));

      auto is_subscript_supported =
          std::all_of(std::begin(loops), std::end(loops),
                      [this](const Loop* l) { return IsSupportedLoop(l); });

      supported = supported && is_subscript_supported;
    }

    if (DeltaTest(coupled_subscripts, distance_vector)) {
      return true;
    }
  }

  // We were unable to prove independence so must gather all of the direction
  // information we found.
  PrintDebug(
      "Couldn't prove independence.\n"
      "All possible direction information has been collected in the input "
      "DistanceVector.");

  return false;
}